

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  ImGuiInputSource IVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar2 = GImGui;
  uVar4 = data_type & 0xfffffffe;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_max - v_min != 0 && v_min <= v_max)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar9 = flags & 1;
  IVar5 = GImGui->ActiveIdSource;
  if (IVar5 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) || ((pIVar2->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar5 = pIVar2->ActiveIdSource;
      goto LAB_00159144;
    }
    fVar14 = (pIVar2->IO).NavInputs[(ulong)uVar9 + 0x1d];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar14 = fVar14 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar14 = fVar14 * 10.0;
    }
  }
  else {
LAB_00159144:
    fVar14 = 0.0;
    if (IVar5 == ImGuiInputSource_Nav) {
      uVar6 = 0;
      if (uVar4 == 8) {
        uVar6 = ImParseFormatPrecision(format,3);
      }
      local_50 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar14 = *(float *)(local_48 + (ulong)uVar9 * 4 + -8);
      if ((int)uVar6 < 0) {
        fVar13 = 1.1754944e-38;
      }
      else if (uVar6 < 10) {
        fVar13 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar6 * 4);
      }
      else {
        local_48 = ZEXT416((uint)fVar14);
        fVar13 = powf(10.0,(float)(int)-uVar6);
        fVar14 = (float)local_48._0_4_;
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar13 <= v_speed) |
                       ~-(uint)(fVar13 <= v_speed) & (uint)fVar13);
    }
  }
  fVar14 = fVar14 * v_speed;
  fVar13 = fVar14;
  if (uVar9 != 0) {
    fVar13 = -fVar14;
  }
  iVar8 = v_max - v_min;
  if (iVar8 == 0 || v_max < v_min) {
    bVar3 = false;
LAB_0015928d:
    bVar1 = false;
  }
  else {
    if ((*v < v_max) || (bVar3 = true, fVar13 <= 0.0)) {
      bVar3 = fVar13 < 0.0 && *v <= v_min;
    }
    if ((v_max <= v_min || uVar4 != 8) || power == 1.0) goto LAB_0015928d;
    if ((fVar13 < 0.0) && (0.0 < pIVar2->DragCurrentAccum)) goto LAB_001592c3;
    if (fVar13 <= 0.0) goto LAB_0015928d;
    bVar1 = pIVar2->DragCurrentAccum <= 0.0 && pIVar2->DragCurrentAccum != 0.0;
  }
  if (((pIVar2->ActiveIdIsJustActivated == false) && (!bVar3)) && (!bVar1)) {
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar13;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if ((v_max <= v_min || uVar4 != 8) || power == 1.0) {
      iVar7 = RoundScalarWithFormatT<int,int>(format,data_type,*v + (int)pIVar2->DragCurrentAccum);
      pIVar2->DragCurrentAccumDirty = false;
      iVar8 = *v;
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(iVar7 - iVar8);
    }
    else {
      fVar12 = (float)iVar8;
      fVar10 = powf((float)(*v - v_min) / fVar12,1.0 / power);
      fVar11 = pIVar2->DragCurrentAccum / fVar12 + fVar10;
      fVar14 = 1.0;
      if (fVar11 <= 1.0) {
        fVar14 = fVar11;
      }
      fVar14 = powf((float)(~-(uint)(fVar11 < 0.0) & (uint)fVar14),power);
      iVar7 = RoundScalarWithFormatT<int,int>(format,data_type,(int)fVar14 * iVar8 + v_min);
      pIVar2->DragCurrentAccumDirty = false;
      fVar14 = powf((float)(iVar7 - v_min) / fVar12,1.0 / power);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (fVar14 - fVar10);
      iVar8 = *v;
    }
    if ((v_min < v_max) && (iVar8 != iVar7)) {
      if ((iVar7 < v_min) || (((uVar4 != 8 && (iVar8 < iVar7)) && (fVar13 < 0.0)))) {
        iVar7 = v_min;
      }
      if ((v_max < iVar7) || (((uVar4 != 8 && (iVar7 < iVar8)) && (0.0 < fVar13)))) {
        iVar7 = v_max;
      }
    }
    if (iVar8 == iVar7) {
      return false;
    }
    *v = iVar7;
    return true;
  }
LAB_001592c3:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}